

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLFeeder_Easy::FillNonlinearVars(NLFeeder_Easy *this)

{
  int *piVar1;
  int *piVar2;
  size_t sVar3;
  bool bVar4;
  reference rVar5;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->nlv_obj_,(long)(this->nlme_).vars_.num_col_,false);
  sVar3 = (this->nlme_).Q_.num_nz_;
  if (sVar3 != 0) {
    piVar2 = (this->nlme_).Q_.index_;
    piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_objs;
    *piVar1 = *piVar1 + 1;
    while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->nlv_obj_,(long)piVar2[sVar3]);
      *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
      piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_vars_in_objs;
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void FillNonlinearVars() {
    nlv_obj_.resize(NLME().NumCols());
    auto Q=NLME().Hessian();
    if (Q.num_nz_) {
      ++header_.num_nl_objs;                // STATS
      for (auto i=Q.num_nz_; i--; ) {
        assert(i<nlv_obj_.size());
        nlv_obj_[Q.index_[i]] = true;
        ++header_.num_nl_vars_in_objs;      // STATS
      }
    }
  }